

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_generated_core_validation.cpp
# Opt level: O2

XrResult ValidateXrStruct(GenValidUsageXrInstanceInfo *instance_info,string *command_name,
                         vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                         *objects_info,bool check_members,bool check_pnext,
                         XrMarkerDetectorCustomProfileInfoML *value)

{
  bool bVar1;
  NextChainResult NVar2;
  _Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *this;
  XrResult XVar3;
  uint32_t in_stack_fffffffffffffcfc;
  string local_300;
  allocator local_2d9;
  string *local_2d8;
  allocator local_2c9;
  string local_2c8;
  vector<XrStructureType,_std::allocator<XrStructureType>_> valid_ext_structs;
  vector<XrStructureType,_std::allocator<XrStructureType>_> duplicate_ext_structs;
  _Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_268;
  _Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_250;
  _Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_238;
  _Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_220;
  _Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_208;
  _Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_1f0;
  _Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_1d8;
  string error_message;
  vector<XrStructureType,_std::allocator<XrStructureType>_> encountered_structs;
  
  XVar3 = XR_SUCCESS;
  local_2d8 = command_name;
  if (value->type != XR_TYPE_MARKER_DETECTOR_CUSTOM_PROFILE_INFO_ML) {
    XVar3 = XR_ERROR_VALIDATION_FAILURE;
    InvalidStructureType
              (instance_info,command_name,objects_info,"XrMarkerDetectorCustomProfileInfoML",
               value->type,"VUID-XrMarkerDetectorCustomProfileInfoML-type-type",
               XR_TYPE_MARKER_DETECTOR_CUSTOM_PROFILE_INFO_ML,
               "XR_TYPE_MARKER_DETECTOR_CUSTOM_PROFILE_INFO_ML");
  }
  if (!check_pnext) goto LAB_0017dea4;
  valid_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  duplicate_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  valid_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  valid_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  duplicate_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  duplicate_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  encountered_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  encountered_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  encountered_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  NVar2 = ValidateNextChain(instance_info,local_2d8,objects_info,value->next,&valid_ext_structs,
                            &encountered_structs,&duplicate_ext_structs);
  if (NVar2 == NEXT_CHAIN_RESULT_DUPLICATE_STRUCT) {
    std::__cxx11::string::string
              ((string *)&error_message,
               "Multiple structures of the same type(s) in \"next\" chain for ",
               (allocator *)&local_300);
    std::__cxx11::string::append((char *)&error_message);
    StructTypesToString_abi_cxx11_(&local_300,instance_info,&duplicate_ext_structs);
    std::__cxx11::string::append((string *)&error_message);
    std::__cxx11::string::~string((string *)&local_300);
    std::__cxx11::string::string
              ((string *)&local_300,"VUID-XrMarkerDetectorCustomProfileInfoML-next-unique",
               &local_2d9);
    std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
              ((vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
               &local_1f0,objects_info);
    std::__cxx11::string::string
              ((string *)&local_2c8,
               "Multiple structures of the same type(s) in \"next\" chain for XrMarkerDetectorCustomProfileInfoML struct"
               ,&local_2c9);
    CoreValidLogMessage(instance_info,&local_300,VALID_USAGE_DEBUG_SEVERITY_ERROR,local_2d8,
                        (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                         *)&local_1f0,&local_2c8);
    std::__cxx11::string::~string((string *)&local_2c8);
    std::_Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::
    ~_Vector_base(&local_1f0);
    std::__cxx11::string::~string((string *)&local_300);
LAB_0017de6f:
    std::__cxx11::string::~string((string *)&error_message);
    XVar3 = XR_ERROR_VALIDATION_FAILURE;
  }
  else if (NVar2 == NEXT_CHAIN_RESULT_ERROR) {
    std::__cxx11::string::string
              ((string *)&error_message,"VUID-XrMarkerDetectorCustomProfileInfoML-next-next",
               (allocator *)&local_2c8);
    std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
              ((vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
               &local_1d8,objects_info);
    std::__cxx11::string::string
              ((string *)&local_300,
               "Invalid structure(s) in \"next\" chain for XrMarkerDetectorCustomProfileInfoML struct \"next\""
               ,&local_2d9);
    CoreValidLogMessage(instance_info,&error_message,VALID_USAGE_DEBUG_SEVERITY_ERROR,local_2d8,
                        (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                         *)&local_1d8,&local_300);
    std::__cxx11::string::~string((string *)&local_300);
    std::_Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::
    ~_Vector_base(&local_1d8);
    goto LAB_0017de6f;
  }
  std::_Vector_base<XrStructureType,_std::allocator<XrStructureType>_>::~_Vector_base
            (&encountered_structs.
              super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>);
  std::_Vector_base<XrStructureType,_std::allocator<XrStructureType>_>::~_Vector_base
            (&duplicate_ext_structs.
              super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>);
  std::_Vector_base<XrStructureType,_std::allocator<XrStructureType>_>::~_Vector_base
            (&valid_ext_structs.
              super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>);
LAB_0017dea4:
  if (check_members && XVar3 == XR_SUCCESS) {
    std::__cxx11::string::string
              ((string *)&error_message,"XrMarkerDetectorCustomProfileInfoML",
               (allocator *)&local_2c8);
    std::__cxx11::string::string((string *)&local_300,"fpsHint",(allocator *)&valid_ext_structs);
    bVar1 = ValidateXrEnum(instance_info,local_2d8,&error_message,&local_300,objects_info,
                           value->fpsHint);
    std::__cxx11::string::~string((string *)&local_300);
    std::__cxx11::string::~string((string *)&error_message);
    if (bVar1) {
      std::__cxx11::string::string
                ((string *)&error_message,"XrMarkerDetectorCustomProfileInfoML",
                 (allocator *)&local_2c8);
      std::__cxx11::string::string
                ((string *)&local_300,"resolutionHint",(allocator *)&valid_ext_structs);
      bVar1 = ValidateXrEnum(instance_info,local_2d8,&error_message,&local_300,objects_info,
                             value->resolutionHint);
      std::__cxx11::string::~string((string *)&local_300);
      std::__cxx11::string::~string((string *)&error_message);
      if (bVar1) {
        std::__cxx11::string::string
                  ((string *)&error_message,"XrMarkerDetectorCustomProfileInfoML",
                   (allocator *)&local_2c8);
        std::__cxx11::string::string
                  ((string *)&local_300,"cameraHint",(allocator *)&valid_ext_structs);
        bVar1 = ValidateXrEnum(instance_info,local_2d8,&error_message,&local_300,objects_info,
                               value->cameraHint);
        std::__cxx11::string::~string((string *)&local_300);
        std::__cxx11::string::~string((string *)&error_message);
        if (bVar1) {
          std::__cxx11::string::string
                    ((string *)&error_message,"XrMarkerDetectorCustomProfileInfoML",
                     (allocator *)&local_2c8);
          std::__cxx11::string::string
                    ((string *)&local_300,"cornerRefineMethod",(allocator *)&valid_ext_structs);
          bVar1 = ValidateXrEnum(instance_info,local_2d8,&error_message,&local_300,objects_info,
                                 value->cornerRefineMethod);
          std::__cxx11::string::~string((string *)&local_300);
          std::__cxx11::string::~string((string *)&error_message);
          if (bVar1) {
            std::__cxx11::string::string
                      ((string *)&error_message,"XrMarkerDetectorCustomProfileInfoML",
                       (allocator *)&local_2c8);
            std::__cxx11::string::string
                      ((string *)&local_300,"fullAnalysisIntervalHint",
                       (allocator *)&valid_ext_structs);
            bVar1 = ValidateXrEnum(instance_info,local_2d8,&error_message,&local_300,objects_info,
                                   value->fullAnalysisIntervalHint);
            std::__cxx11::string::~string((string *)&local_300);
            std::__cxx11::string::~string((string *)&error_message);
            if (bVar1) {
              return XR_SUCCESS;
            }
            std::__cxx11::ostringstream::ostringstream((ostringstream *)&error_message);
            std::operator<<((ostream *)&error_message,
                            "XrMarkerDetectorCustomProfileInfoML contains invalid XrMarkerDetectorFullAnalysisIntervalML \"fullAnalysisIntervalHint\" enum value "
                           );
            Uint32ToHexString_abi_cxx11_(in_stack_fffffffffffffcfc);
            std::operator<<((ostream *)&error_message,(string *)&local_300);
            std::__cxx11::string::~string((string *)&local_300);
            std::__cxx11::string::string
                      ((string *)&local_300,
                       "VUID-XrMarkerDetectorCustomProfileInfoML-fullAnalysisIntervalHint-parameter"
                       ,(allocator *)&valid_ext_structs);
            std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::
            vector((vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
                   &local_268,objects_info);
            std::__cxx11::stringbuf::str();
            CoreValidLogMessage(instance_info,&local_300,VALID_USAGE_DEBUG_SEVERITY_ERROR,local_2d8,
                                (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                                 *)&local_268,&local_2c8);
            std::__cxx11::string::~string((string *)&local_2c8);
            this = &local_268;
          }
          else {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)&error_message);
            std::operator<<((ostream *)&error_message,
                            "XrMarkerDetectorCustomProfileInfoML contains invalid XrMarkerDetectorCornerRefineMethodML \"cornerRefineMethod\" enum value "
                           );
            Uint32ToHexString_abi_cxx11_(in_stack_fffffffffffffcfc);
            std::operator<<((ostream *)&error_message,(string *)&local_300);
            std::__cxx11::string::~string((string *)&local_300);
            std::__cxx11::string::string
                      ((string *)&local_300,
                       "VUID-XrMarkerDetectorCustomProfileInfoML-cornerRefineMethod-parameter",
                       (allocator *)&valid_ext_structs);
            std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::
            vector((vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
                   &local_250,objects_info);
            std::__cxx11::stringbuf::str();
            CoreValidLogMessage(instance_info,&local_300,VALID_USAGE_DEBUG_SEVERITY_ERROR,local_2d8,
                                (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                                 *)&local_250,&local_2c8);
            std::__cxx11::string::~string((string *)&local_2c8);
            this = &local_250;
          }
        }
        else {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&error_message);
          std::operator<<((ostream *)&error_message,
                          "XrMarkerDetectorCustomProfileInfoML contains invalid XrMarkerDetectorCameraML \"cameraHint\" enum value "
                         );
          Uint32ToHexString_abi_cxx11_(in_stack_fffffffffffffcfc);
          std::operator<<((ostream *)&error_message,(string *)&local_300);
          std::__cxx11::string::~string((string *)&local_300);
          std::__cxx11::string::string
                    ((string *)&local_300,
                     "VUID-XrMarkerDetectorCustomProfileInfoML-cameraHint-parameter",
                     (allocator *)&valid_ext_structs);
          std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
                    ((vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                      *)&local_238,objects_info);
          std::__cxx11::stringbuf::str();
          CoreValidLogMessage(instance_info,&local_300,VALID_USAGE_DEBUG_SEVERITY_ERROR,local_2d8,
                              (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                               *)&local_238,&local_2c8);
          std::__cxx11::string::~string((string *)&local_2c8);
          this = &local_238;
        }
      }
      else {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&error_message);
        std::operator<<((ostream *)&error_message,
                        "XrMarkerDetectorCustomProfileInfoML contains invalid XrMarkerDetectorResolutionML \"resolutionHint\" enum value "
                       );
        Uint32ToHexString_abi_cxx11_(in_stack_fffffffffffffcfc);
        std::operator<<((ostream *)&error_message,(string *)&local_300);
        std::__cxx11::string::~string((string *)&local_300);
        std::__cxx11::string::string
                  ((string *)&local_300,
                   "VUID-XrMarkerDetectorCustomProfileInfoML-resolutionHint-parameter",
                   (allocator *)&valid_ext_structs);
        std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
                  ((vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
                   &local_220,objects_info);
        std::__cxx11::stringbuf::str();
        CoreValidLogMessage(instance_info,&local_300,VALID_USAGE_DEBUG_SEVERITY_ERROR,local_2d8,
                            (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                             *)&local_220,&local_2c8);
        std::__cxx11::string::~string((string *)&local_2c8);
        this = &local_220;
      }
    }
    else {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&error_message);
      std::operator<<((ostream *)&error_message,
                      "XrMarkerDetectorCustomProfileInfoML contains invalid XrMarkerDetectorFpsML \"fpsHint\" enum value "
                     );
      Uint32ToHexString_abi_cxx11_(in_stack_fffffffffffffcfc);
      std::operator<<((ostream *)&error_message,(string *)&local_300);
      std::__cxx11::string::~string((string *)&local_300);
      std::__cxx11::string::string
                ((string *)&local_300,"VUID-XrMarkerDetectorCustomProfileInfoML-fpsHint-parameter",
                 (allocator *)&valid_ext_structs);
      std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
                ((vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
                 &local_208,objects_info);
      std::__cxx11::stringbuf::str();
      CoreValidLogMessage(instance_info,&local_300,VALID_USAGE_DEBUG_SEVERITY_ERROR,local_2d8,
                          (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                           *)&local_208,&local_2c8);
      std::__cxx11::string::~string((string *)&local_2c8);
      this = &local_208;
    }
    std::_Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::
    ~_Vector_base(this);
    std::__cxx11::string::~string((string *)&local_300);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&error_message);
    XVar3 = XR_ERROR_VALIDATION_FAILURE;
  }
  return XVar3;
}

Assistant:

XrResult ValidateXrStruct(GenValidUsageXrInstanceInfo *instance_info, const std::string &command_name,
                          std::vector<GenValidUsageXrObjectInfo>& objects_info, bool check_members, bool check_pnext,
                          const XrMarkerDetectorCustomProfileInfoML* value) {
    XrResult xr_result = XR_SUCCESS;
    (void)xr_result;
    (void)instance_info;
    (void)command_name;
    (void)objects_info;
    (void)check_members;
    (void)value;
    // Make sure the structure type is correct
    if (value->type != XR_TYPE_MARKER_DETECTOR_CUSTOM_PROFILE_INFO_ML) {
        InvalidStructureType(instance_info, command_name, objects_info, "XrMarkerDetectorCustomProfileInfoML",
                             value->type, "VUID-XrMarkerDetectorCustomProfileInfoML-type-type", XR_TYPE_MARKER_DETECTOR_CUSTOM_PROFILE_INFO_ML, "XR_TYPE_MARKER_DETECTOR_CUSTOM_PROFILE_INFO_ML");
        xr_result = XR_ERROR_VALIDATION_FAILURE;
    }
    if (check_pnext) {
        std::vector<XrStructureType> valid_ext_structs;
        std::vector<XrStructureType> duplicate_ext_structs;
        std::vector<XrStructureType> encountered_structs;
        NextChainResult next_result = ValidateNextChain(instance_info, command_name, objects_info,
                                                         value->next, valid_ext_structs,
                                                         encountered_structs,
                                                         duplicate_ext_structs);
        // No valid extension structs for this 'next'.  Therefore, must be NULL
        // or only contain a list of valid extension structures.
        if (NEXT_CHAIN_RESULT_ERROR == next_result) {
            CoreValidLogMessage(instance_info, "VUID-XrMarkerDetectorCustomProfileInfoML-next-next",
                                VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                                objects_info, "Invalid structure(s) in \"next\" chain for XrMarkerDetectorCustomProfileInfoML struct \"next\"");
            xr_result = XR_ERROR_VALIDATION_FAILURE;
        } else if (NEXT_CHAIN_RESULT_DUPLICATE_STRUCT == next_result) {
            std::string error_message = "Multiple structures of the same type(s) in \"next\" chain for ";
            error_message += "XrMarkerDetectorCustomProfileInfoML : ";
            error_message += StructTypesToString(instance_info, duplicate_ext_structs);
            CoreValidLogMessage(instance_info, "VUID-XrMarkerDetectorCustomProfileInfoML-next-unique",
                                VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                                objects_info,
            "Multiple structures of the same type(s) in \"next\" chain for XrMarkerDetectorCustomProfileInfoML struct");
            xr_result = XR_ERROR_VALIDATION_FAILURE;
        }
    }
    // If we are not to check the rest of the members, just return here.
    if (!check_members || XR_SUCCESS != xr_result) {
        return xr_result;
    }
    // Make sure the enum type XrMarkerDetectorFpsML value is valid
    if (!ValidateXrEnum(instance_info, command_name, "XrMarkerDetectorCustomProfileInfoML", "fpsHint", objects_info, value->fpsHint)) {
        std::ostringstream oss_enum;
        oss_enum << "XrMarkerDetectorCustomProfileInfoML contains invalid XrMarkerDetectorFpsML \"fpsHint\" enum value ";
        oss_enum << Uint32ToHexString(static_cast<uint32_t>(value->fpsHint));
        CoreValidLogMessage(instance_info, "VUID-XrMarkerDetectorCustomProfileInfoML-fpsHint-parameter",
                            VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                            objects_info, oss_enum.str());
        return XR_ERROR_VALIDATION_FAILURE;
    }
    // Make sure the enum type XrMarkerDetectorResolutionML value is valid
    if (!ValidateXrEnum(instance_info, command_name, "XrMarkerDetectorCustomProfileInfoML", "resolutionHint", objects_info, value->resolutionHint)) {
        std::ostringstream oss_enum;
        oss_enum << "XrMarkerDetectorCustomProfileInfoML contains invalid XrMarkerDetectorResolutionML \"resolutionHint\" enum value ";
        oss_enum << Uint32ToHexString(static_cast<uint32_t>(value->resolutionHint));
        CoreValidLogMessage(instance_info, "VUID-XrMarkerDetectorCustomProfileInfoML-resolutionHint-parameter",
                            VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                            objects_info, oss_enum.str());
        return XR_ERROR_VALIDATION_FAILURE;
    }
    // Make sure the enum type XrMarkerDetectorCameraML value is valid
    if (!ValidateXrEnum(instance_info, command_name, "XrMarkerDetectorCustomProfileInfoML", "cameraHint", objects_info, value->cameraHint)) {
        std::ostringstream oss_enum;
        oss_enum << "XrMarkerDetectorCustomProfileInfoML contains invalid XrMarkerDetectorCameraML \"cameraHint\" enum value ";
        oss_enum << Uint32ToHexString(static_cast<uint32_t>(value->cameraHint));
        CoreValidLogMessage(instance_info, "VUID-XrMarkerDetectorCustomProfileInfoML-cameraHint-parameter",
                            VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                            objects_info, oss_enum.str());
        return XR_ERROR_VALIDATION_FAILURE;
    }
    // Make sure the enum type XrMarkerDetectorCornerRefineMethodML value is valid
    if (!ValidateXrEnum(instance_info, command_name, "XrMarkerDetectorCustomProfileInfoML", "cornerRefineMethod", objects_info, value->cornerRefineMethod)) {
        std::ostringstream oss_enum;
        oss_enum << "XrMarkerDetectorCustomProfileInfoML contains invalid XrMarkerDetectorCornerRefineMethodML \"cornerRefineMethod\" enum value ";
        oss_enum << Uint32ToHexString(static_cast<uint32_t>(value->cornerRefineMethod));
        CoreValidLogMessage(instance_info, "VUID-XrMarkerDetectorCustomProfileInfoML-cornerRefineMethod-parameter",
                            VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                            objects_info, oss_enum.str());
        return XR_ERROR_VALIDATION_FAILURE;
    }
    // Make sure the enum type XrMarkerDetectorFullAnalysisIntervalML value is valid
    if (!ValidateXrEnum(instance_info, command_name, "XrMarkerDetectorCustomProfileInfoML", "fullAnalysisIntervalHint", objects_info, value->fullAnalysisIntervalHint)) {
        std::ostringstream oss_enum;
        oss_enum << "XrMarkerDetectorCustomProfileInfoML contains invalid XrMarkerDetectorFullAnalysisIntervalML \"fullAnalysisIntervalHint\" enum value ";
        oss_enum << Uint32ToHexString(static_cast<uint32_t>(value->fullAnalysisIntervalHint));
        CoreValidLogMessage(instance_info, "VUID-XrMarkerDetectorCustomProfileInfoML-fullAnalysisIntervalHint-parameter",
                            VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                            objects_info, oss_enum.str());
        return XR_ERROR_VALIDATION_FAILURE;
    }
    // Everything checked out properly
    return xr_result;
}